

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

float64 vector_dist_maha(float32 *vec,float32 *mean,float32 *varinv,float64 loginvdet,int32 len)

{
  int local_44;
  int32 i;
  float64 diff;
  float64 dist;
  int32 len_local;
  float64 loginvdet_local;
  float32 *varinv_local;
  float32 *mean_local;
  float32 *vec_local;
  
  diff = loginvdet;
  for (local_44 = 0; local_44 < len; local_44 = local_44 + 1) {
    diff = (float64)(-((double)((float)vec[local_44] - (float)mean[local_44]) *
                      (double)((float)vec[local_44] - (float)mean[local_44])) *
                     (double)(float)varinv[local_44] + (double)diff);
  }
  return diff;
}

Assistant:

float64
vector_dist_maha(float32 * vec, float32 * mean, float32 * varinv,
                 float64 loginvdet, int32 len)
{
    float64 dist, diff;
    int32 i;

    dist = loginvdet;
    for (i = 0; i < len; i++) {
        diff = (vec[i] - mean[i]);
        dist -= diff * diff * varinv[i];
    }

    return dist;
}